

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2b79c0::OwnershipAnalysis::OwnershipAnalysis
          (OwnershipAnalysis *this,command_set *commands,BuildFileDelegate *fileDelegate)

{
  _Rb_tree_header *p_Var1;
  pointer *pppVar2;
  StringMapEntryBase **ppSVar3;
  Command *pCVar4;
  pointer ppBVar5;
  BuildNode *pBVar6;
  iterator iVar7;
  pointer ppVar8;
  pointer ppVar9;
  long lVar10;
  StringMapEntryBase *pSVar11;
  ulong uVar12;
  StringMapEntryBase **ppSVar13;
  __normal_iterator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_*,_std::vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>_>
  __i;
  pointer ppBVar14;
  pointer ppVar15;
  pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> local_58;
  command_set *local_48;
  vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>
  *local_40;
  vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>
  *local_38;
  
  p_Var1 = &(this->includedPaths)._M_t._M_impl.super__Rb_tree_header;
  (this->includedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->includedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->includedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->includedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->includedPaths)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->excludedPaths)._M_t._M_impl.super__Rb_tree_header;
  (this->excludedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->excludedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->excludedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->excludedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->excludedPaths)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->fileDelegate = fileDelegate;
  (this->outputNodesAndCommands).
  super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->outputNodesAndCommands).
  super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->outputNodesAndCommands).
  super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->directoryInputNodesAndCommands).
  super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->directoryInputNodesAndCommands).
  super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->directoryInputNodesAndCommands).
  super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppSVar3 = (commands->super_StringMapImpl).TheTable;
  uVar12 = (ulong)(commands->super_StringMapImpl).NumBuckets;
  ppSVar13 = ppSVar3;
  if (uVar12 != 0) {
    for (; (*ppSVar13 == (StringMapEntryBase *)0x0 ||
           (*ppSVar13 == (StringMapEntryBase *)0xfffffffffffffff8)); ppSVar13 = ppSVar13 + 1) {
    }
  }
  if (ppSVar13 != ppSVar3 + uVar12) {
    local_38 = (vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>
                *)&this->outputNodesAndCommands;
    local_40 = (vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>
                *)&this->directoryInputNodesAndCommands;
    pSVar11 = *ppSVar13;
    local_48 = commands;
    do {
      pCVar4 = (Command *)pSVar11[1].StrLen;
      ppBVar5 = *(pointer *)
                 ((long)&(pCVar4->outputs).
                         super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                         ._M_impl.super__Vector_impl_data + 8);
      for (ppBVar14 = (pCVar4->outputs).
                      super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppBVar14 != ppBVar5;
          ppBVar14 = ppBVar14 + 1) {
        pBVar6 = *ppBVar14;
        if (pBVar6->type != Virtual) {
          iVar7._M_current =
               (this->outputNodesAndCommands).
               super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_58.first = pBVar6;
          if (iVar7._M_current ==
              (this->outputNodesAndCommands).
              super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_58.second = pCVar4;
            std::
            vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>
            ::
            _M_realloc_insert<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>
                      (local_38,iVar7,&local_58);
          }
          else {
            (iVar7._M_current)->first = pBVar6;
            (iVar7._M_current)->second = pCVar4;
            pppVar2 = &(this->outputNodesAndCommands).
                       super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar2 = *pppVar2 + 1;
            local_58.second = pCVar4;
          }
        }
      }
      ppBVar5 = *(pointer *)
                 ((long)&(pCVar4->inputs).
                         super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                         ._M_impl.super__Vector_impl_data + 8);
      for (ppBVar14 = (pCVar4->inputs).
                      super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppBVar14 != ppBVar5;
          ppBVar14 = ppBVar14 + 1) {
        pBVar6 = *ppBVar14;
        if (pBVar6->type == Directory) {
          iVar7._M_current =
               (this->directoryInputNodesAndCommands).
               super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_58.first = pBVar6;
          if (iVar7._M_current ==
              (this->directoryInputNodesAndCommands).
              super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_58.second = pCVar4;
            std::
            vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>
            ::
            _M_realloc_insert<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>
                      (local_40,iVar7,&local_58);
          }
          else {
            (iVar7._M_current)->first = pBVar6;
            (iVar7._M_current)->second = pCVar4;
            pppVar2 = &(this->directoryInputNodesAndCommands).
                       super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar2 = *pppVar2 + 1;
            local_58.second = pCVar4;
          }
        }
      }
      do {
        do {
          ppSVar13 = ppSVar13 + 1;
          pSVar11 = *ppSVar13;
        } while (pSVar11 == (StringMapEntryBase *)0x0);
      } while (pSVar11 == (StringMapEntryBase *)0xfffffffffffffff8);
    } while (ppSVar13 !=
             (local_48->super_StringMapImpl).TheTable + (local_48->super_StringMapImpl).NumBuckets);
    ppVar8 = (this->outputNodesAndCommands).
             super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar9 = (this->outputNodesAndCommands).
             super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar8 != ppVar9) {
      uVar12 = (long)ppVar9 - (long)ppVar8 >> 4;
      lVar10 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>*,std::vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::OwnershipAnalysis::OwnershipAnalysis(llvm::StringMap<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>,llvm::MallocAllocator>const&,llbuild::buildsystem::BuildFileDelegate&)::_lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)_1_>>
                (ppVar8,ppVar9,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)ppVar9 - (long)ppVar8 < 0x101) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>*,std::vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::OwnershipAnalysis::OwnershipAnalysis(llvm::StringMap<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>,llvm::MallocAllocator>const&,llbuild::buildsystem::BuildFileDelegate&)::_lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)_1_>>
                  (ppVar8,ppVar9);
      }
      else {
        ppVar15 = ppVar8 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>*,std::vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::OwnershipAnalysis::OwnershipAnalysis(llvm::StringMap<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>,llvm::MallocAllocator>const&,llbuild::buildsystem::BuildFileDelegate&)::_lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)_1_>>
                  (ppVar8,ppVar15);
        for (; ppVar15 != ppVar9; ppVar15 = ppVar15 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>*,std::vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::OwnershipAnalysis::OwnershipAnalysis(llvm::StringMap<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>,llvm::MallocAllocator>const&,llbuild::buildsystem::BuildFileDelegate&)::_lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)_1_>>
                    (ppVar15);
        }
      }
    }
  }
  return;
}

Assistant:

OwnershipAnalysis(const BuildDescription::command_set& commands, BuildFileDelegate& fileDelegate): fileDelegate(fileDelegate) {
    // Extract outputs and directory inputs of all commands
    for (auto it = commands.begin(); it != commands.end(); it++) {
      Command* command = (*it).getValue().get();
      for (auto output: command->getOutputs()) {
        if (!output->isVirtual()) {
          outputNodesAndCommands.push_back(std::pair<BuildNode*, Command*>(output, command));
        }
      }

      for (auto input: command->getInputs()) {
        if (input->isDirectory()) {
          directoryInputNodesAndCommands.push_back(std::pair<BuildNode*, Command*>(input, command));
        }
      }
    }

    // Sort paths according to length to ensure we assign owner to parent before assigning owner to its subpaths
    std::sort(outputNodesAndCommands.begin(),
              outputNodesAndCommands.end(),
              [](const std::pair<BuildNode*, Command*> pairA,
                 const std::pair<BuildNode*, Command*> pairB) -> bool {
      return pairA.first->getName().str().length() < pairB.first->getName().str().length();
    });
  }